

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_processing.c
# Opt level: O0

void ApplyAlphaMultiply_C(uint8_t *rgba,int alpha_first,int w,int h,int stride)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  uint32_t mult;
  uint32_t a;
  int i;
  uint8_t *alpha;
  uint8_t *rgb;
  int stride_local;
  int h_local;
  int w_local;
  int alpha_first_local;
  uint8_t *rgba_local;
  
  h_local = h;
  rgba_local = rgba;
  while (0 < h_local) {
    bVar3 = alpha_first != 0;
    iVar2 = 3;
    if (alpha_first != 0) {
      iVar2 = 0;
    }
    for (i = 0; i < w; i = i + 1) {
      if (rgba_local[(long)(i << 2) + (long)iVar2] != 0xff) {
        iVar1 = (uint)rgba_local[(long)(i << 2) + (long)iVar2] * 0x8081;
        rgba_local[(long)(i << 2) + (long)(int)(uint)bVar3] =
             (uint8_t)((uint)rgba_local[(long)(i << 2) + (long)(int)(uint)bVar3] * iVar1 >> 0x17);
        rgba_local[(long)(i * 4 + 1) + (long)(int)(uint)bVar3] =
             (uint8_t)((uint)rgba_local[(long)(i * 4 + 1) + (long)(int)(uint)bVar3] * iVar1 >> 0x17)
        ;
        rgba_local[(long)(i * 4 + 2) + (long)(int)(uint)bVar3] =
             (uint8_t)((uint)rgba_local[(long)(i * 4 + 2) + (long)(int)(uint)bVar3] * iVar1 >> 0x17)
        ;
      }
    }
    rgba_local = rgba_local + stride;
    h_local = h_local + -1;
  }
  return;
}

Assistant:

static void ApplyAlphaMultiply_C(uint8_t* rgba, int alpha_first,
                                 int w, int h, int stride) {
  while (h-- > 0) {
    uint8_t* const rgb = rgba + (alpha_first ? 1 : 0);
    const uint8_t* const alpha = rgba + (alpha_first ? 0 : 3);
    int i;
    for (i = 0; i < w; ++i) {
      const uint32_t a = alpha[4 * i];
      if (a != 0xff) {
        const uint32_t mult = MULTIPLIER(a);
        rgb[4 * i + 0] = PREMULTIPLY(rgb[4 * i + 0], mult);
        rgb[4 * i + 1] = PREMULTIPLY(rgb[4 * i + 1], mult);
        rgb[4 * i + 2] = PREMULTIPLY(rgb[4 * i + 2], mult);
      }
    }
    rgba += stride;
  }
}